

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVstone INT_EVexecuting_stone(CManager_conflict cm)

{
  ev_handler_activation_ptr p_Var1;
  ev_handler_activation_ptr rec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  EVstone EVar2;
  
  p_Var1 = find_activation_record_from_stack
                     ((CManager_conflict)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (p_Var1 == (ev_handler_activation_ptr)0x0) {
    EVar2 = -1;
  }
  else {
    EVar2 = p_Var1->stone_id;
  }
  return EVar2;
}

Assistant:

extern EVstone
INT_EVexecuting_stone(CManager cm)
{
    ev_handler_activation_ptr rec = find_activation_record_from_stack(cm);
    if (!rec) return -1;
    return rec->stone_id;
}